

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.cpp
# Opt level: O2

void __thiscall setup::task_entry::load(task_entry *this,istream *is,info *i)

{
  bool bVar1;
  uint uVar2;
  flag_type fVar3;
  stored_flag_reader<flags<setup::task_entry::flags_Enum_,_5UL>_> flagreader;
  
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pos = 0;
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pad_bits = (size_t)this;
  util::operator>>(is,(encoded_string *)&flagreader);
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pad_bits =
       (size_t)&this->description;
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pos = 0;
  util::operator>>(is,(encoded_string *)&flagreader);
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pad_bits =
       (size_t)&this->group_description;
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pos = 0;
  util::operator>>(is,(encoded_string *)&flagreader);
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pad_bits =
       (size_t)&this->components;
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pos = 0;
  util::operator>>(is,(encoded_string *)&flagreader);
  if ((i->version).value < 0x4000100) {
    (this->languages)._M_string_length = 0;
    *(this->languages)._M_dataplus._M_p = '\0';
  }
  else {
    flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pad_bits =
         (size_t)&this->languages;
    flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream =
         (istream *)
         CONCAT44(flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream._4_4_,
                  i->codepage);
    flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pos = 0;
    util::operator>>(is,(encoded_string *)&flagreader);
  }
  if ((i->version).value < 0x4000000) {
    bVar1 = version::is_isx(&i->version);
    if ((bVar1) && (0x10317ff < (i->version).value)) goto LAB_0013aaa2;
    (this->check)._M_string_length = 0;
    *(this->check)._M_dataplus._M_p = '\0';
  }
  else {
LAB_0013aaa2:
    flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pad_bits =
         (size_t)&this->check;
    flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream =
         (istream *)
         CONCAT44(flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream._4_4_,
                  i->codepage);
    flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pos = 0;
    util::operator>>(is,(encoded_string *)&flagreader);
  }
  if ((i->version).value < 0x4000000) {
    bVar1 = version::is_isx(&i->version);
    uVar2 = (i->version).value;
    if (0x30002ff < uVar2 && bVar1) goto LAB_0013aafd;
    this->level = 0;
  }
  else {
LAB_0013aafd:
    uVar2 = util::load<int,util::little_endian>(is);
    this->level = uVar2;
    uVar2 = (i->version).value;
  }
  if (uVar2 < 0x4000000) {
    bVar1 = version::is_isx(&i->version);
    if ((!bVar1) || ((i->version).value < 0x3000400)) {
      this->used = true;
      goto LAB_0013ab4b;
    }
  }
  bVar1 = util::load_bool(is);
  this->used = bVar1;
LAB_0013ab4b:
  windows_version_range::load(&this->winver,is,&i->version);
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pad_bits = 0x20;
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.pos = 0;
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.buffer = '\0';
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.result._flags.
  super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.bytes = 0;
  flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>.stream = is;
  stored_flag_reader<setup::task_entry::flags_Enum_>::add
            (&flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>,Exclusive);
  stored_flag_reader<setup::task_entry::flags_Enum_>::add
            (&flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>,Unchecked);
  if (0x20004ff < (i->version).value) {
    stored_flag_reader<setup::task_entry::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>,Restart);
    if (0x20005ff < (i->version).value) {
      stored_flag_reader<setup::task_entry::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>,CheckedOnce);
      if (0x40202ff < (i->version).value) {
        stored_flag_reader<setup::task_entry::flags_Enum_>::add
                  (&flagreader.super_stored_flag_reader<setup::task_entry::flags_Enum_>,
                   DontInheritCheck);
      }
    }
  }
  fVar3 = stored_flag_reader<setup::data_entry::flags_Enum_>::finalize
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader);
  (this->options)._flags.super__Base_bitset<1UL>._M_w =
       (_WordT)fVar3._flags.super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

void task_entry::load(std::istream & is, const info & i) {
	
	is >> util::encoded_string(name, i.codepage);
	is >> util::encoded_string(description, i.codepage);
	is >> util::encoded_string(group_description, i.codepage);
	is >> util::encoded_string(components, i.codepage);
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::encoded_string(languages, i.codepage);
	} else {
		languages.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 24))) {
		is >> util::encoded_string(check, i.codepage);
	} else {
		check.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(3, 0, 3))) {
		level = util::load<boost::int32_t>(is);
	} else {
		level = 0;
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(3, 0, 4))) {
		used = util::load_bool(is);
	} else {
		used = true;
	}
	
	winver.load(is, i.version);
	
	stored_flag_reader<flags> flagreader(is);
	
	flagreader.add(Exclusive);
	flagreader.add(Unchecked);
	if(i.version >= INNO_VERSION(2, 0, 5)) {
		flagreader.add(Restart);
	}
	if(i.version >= INNO_VERSION(2, 0, 6)) {
		flagreader.add(CheckedOnce);
	}
	if(i.version >= INNO_VERSION(4, 2, 3)) {
		flagreader.add(DontInheritCheck);
	}
	
	options = flagreader.finalize();
}